

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  char *name;
  int iVar1;
  rnnenum *prVar2;
  rnnbitset *prVar3;
  rnnspectype *prVar4;
  rnnvalue **pprVar5;
  rnnvalue *prVar6;
  rnnbitfield **pprVar7;
  rnnbitfield *prVar8;
  int iVar9;
  long lVar10;
  
  name = ti->name;
  if (name == (char *)0x0) {
    if (ti->bitfieldsnum == 0) {
      if (ti->valsnum != 0) {
        ti->name = "enum";
LAB_00105ef7:
        ti->type = RNN_TTYPE_INLINE_ENUM;
        goto LAB_0010602f;
      }
      if (width == 1) {
        ti->name = "boolean";
LAB_00105f3c:
        ti->type = RNN_TTYPE_BOOLEAN;
        goto LAB_0010602f;
      }
      ti->name = "hex";
LAB_00106027:
      ti->type = RNN_TTYPE_HEX;
      goto LAB_0010602f;
    }
    ti->name = "bitfield";
  }
  else {
    prVar2 = rnn_findenum(db,name);
    prVar3 = rnn_findbitset(db,name);
    prVar4 = rnn_findspectype(db,name);
    if (prVar2 != (rnnenum *)0x0) {
      if (prVar2->isinline == 0) {
        ti->type = RNN_TTYPE_ENUM;
        ti->eenum = prVar2;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_ENUM;
        for (lVar10 = 0; lVar10 < prVar2->valsnum; lVar10 = lVar10 + 1) {
          iVar1 = ti->valsmax;
          if (iVar1 <= ti->valsnum) {
            iVar9 = iVar1 * 2;
            if (iVar1 == 0) {
              iVar9 = 0x10;
            }
            ti->valsmax = iVar9;
            pprVar5 = (rnnvalue **)realloc(ti->vals,(long)iVar9 << 3);
            ti->vals = pprVar5;
          }
          prVar6 = copyvalue(prVar2->vals[lVar10],file);
          iVar1 = ti->valsnum;
          ti->valsnum = iVar1 + 1;
          ti->vals[iVar1] = prVar6;
        }
      }
      goto LAB_0010602f;
    }
    if (prVar3 != (rnnbitset *)0x0) {
      if (prVar3->isinline == 0) {
        ti->type = RNN_TTYPE_BITSET;
        ti->ebitset = prVar3;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_BITSET;
        for (lVar10 = 0; lVar10 < prVar3->bitfieldsnum; lVar10 = lVar10 + 1) {
          iVar1 = ti->bitfieldsmax;
          if (iVar1 <= ti->bitfieldsnum) {
            iVar9 = iVar1 * 2;
            if (iVar1 == 0) {
              iVar9 = 0x10;
            }
            ti->bitfieldsmax = iVar9;
            pprVar7 = (rnnbitfield **)realloc(ti->bitfields,(long)iVar9 << 3);
            ti->bitfields = pprVar7;
          }
          prVar8 = copybitfield(prVar3->bitfields[lVar10],file);
          iVar1 = ti->bitfieldsnum;
          ti->bitfieldsnum = iVar1 + 1;
          ti->bitfields[iVar1] = prVar8;
        }
      }
      goto LAB_0010602f;
    }
    if (prVar4 != (rnnspectype *)0x0) {
      ti->type = RNN_TTYPE_SPECTYPE;
      ti->spectype = prVar4;
      goto LAB_0010602f;
    }
    iVar1 = strcmp(name,"hex");
    if (iVar1 == 0) goto LAB_00106027;
    iVar1 = strcmp(name,"float");
    if (iVar1 == 0) {
      ti->type = RNN_TTYPE_FLOAT;
      goto LAB_0010602f;
    }
    iVar1 = strcmp(name,"uint");
    if (iVar1 == 0) {
      ti->type = RNN_TTYPE_UINT;
      goto LAB_0010602f;
    }
    iVar1 = strcmp(name,"int");
    if (iVar1 == 0) {
      ti->type = RNN_TTYPE_INT;
      goto LAB_0010602f;
    }
    iVar1 = strcmp(name,"boolean");
    if (iVar1 == 0) goto LAB_00105f3c;
    iVar1 = strcmp(name,"bitfield");
    if (iVar1 != 0) {
      iVar1 = strcmp(name,"enum");
      if (iVar1 != 0) {
        ti->type = RNN_TTYPE_HEX;
        fprintf(_stderr,"%s: unknown type %s\n",prefix,name);
        db->estatus = 1;
        goto LAB_0010602f;
      }
      goto LAB_00105ef7;
    }
  }
  ti->type = RNN_TTYPE_INLINE_BITSET;
LAB_0010602f:
  for (lVar10 = 0; lVar10 < ti->bitfieldsnum; lVar10 = lVar10 + 1) {
    prepbitfield(db,ti->bitfields[lVar10],prefix,vi);
  }
  for (lVar10 = 0; lVar10 < ti->valsnum; lVar10 = lVar10 + 1) {
    prepvalue(db,ti->vals[lVar10],prefix,vi);
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = "bitfield";
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = "enum";
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = "boolean";
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = "hex";
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}